

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O1

void __thiscall cppnet::Address::Address(Address *this,AddressType at,string *ip,uint16_t port)

{
  pointer pcVar1;
  
  this->_address_type = at;
  (this->_ip)._M_dataplus._M_p = (pointer)&(this->_ip).field_2;
  pcVar1 = (ip->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_ip,pcVar1,pcVar1 + ip->_M_string_length);
  this->_port = port;
  return;
}

Assistant:

Address::Address(AddressType at, const std::string& ip, uint16_t port):
    _address_type(at),
    _ip(ip),
    _port(port) {

}